

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,LocalSocketState state)

{
  long lVar1;
  Stream *pSVar2;
  long *plVar3;
  QDebug *pQVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *this;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  this = (QDebug *)CONCAT44(in_register_00000034,state);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,this);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  switch(in_EDX) {
  case 0:
    t = "QLocalSocket::UnconnectedState";
    break;
  default:
    pQVar4 = QDebug::operator<<(this,"QLocalSocket::SocketState(");
    pQVar4 = QDebug::operator<<(pQVar4,in_EDX);
    QDebug::operator<<(pQVar4,')');
    goto LAB_0022621d;
  case 2:
    t = "QLocalSocket::ConnectingState";
    break;
  case 3:
    t = "QLocalSocket::ConnectedState";
    break;
  case 6:
    t = "QLocalSocket::ClosingState";
  }
  QDebug::operator<<(this,t);
LAB_0022621d:
  pSVar2 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QLocalSocket::LocalSocketState state)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (state) {
    case QLocalSocket::UnconnectedState:
        debug << "QLocalSocket::UnconnectedState";
        break;
    case QLocalSocket::ConnectingState:
        debug << "QLocalSocket::ConnectingState";
        break;
    case QLocalSocket::ConnectedState:
        debug << "QLocalSocket::ConnectedState";
        break;
    case QLocalSocket::ClosingState:
        debug << "QLocalSocket::ClosingState";
        break;
    default:
        debug << "QLocalSocket::SocketState(" << int(state) << ')';
        break;
    }
    return debug;
}